

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_LS.h
# Opt level: O1

void __thiscall fanuc_post_processor::generate_LS::left_command(generate_LS *this)

{
  pointer paVar1;
  pointer paVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  long *plVar9;
  ulong *puVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint __uval;
  string __str_1;
  string __str;
  ulong *local_1a0;
  long local_198;
  ulong local_190;
  long lStack_188;
  ulong local_180;
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  long *local_158;
  undefined8 local_150;
  long local_148;
  undefined8 uStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  ulong local_38;
  
  paVar1 = (this->pos_).
           super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  paVar2 = (this->pos_).
           super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)paVar1 - (long)paVar2 >> 3;
  this->line_cnt = (int)lVar5 * 0x49249249 + this->line_cnt + 2;
  if (paVar1 == paVar2) {
    uVar8 = lVar5 * 0x6db6db6db6db6db7;
  }
  else {
    local_180 = 0;
    do {
      uVar13 = this->line_cnt + (int)(local_180 + 1);
      uVar11 = -uVar13;
      if (0 < (int)uVar13) {
        uVar11 = uVar13;
      }
      uVar12 = 1;
      if (9 < uVar11) {
        uVar8 = (ulong)uVar11;
        uVar3 = 4;
        do {
          uVar12 = uVar3;
          uVar4 = (uint)uVar8;
          if (uVar4 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_0010337f;
          }
          if (uVar4 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_0010337f;
          }
          if (uVar4 < 10000) goto LAB_0010337f;
          uVar8 = uVar8 / 10000;
          uVar3 = uVar12 + 4;
        } while (99999 < uVar4);
        uVar12 = uVar12 + 1;
      }
LAB_0010337f:
      local_78[0] = local_68;
      local_38 = local_180;
      local_180 = local_180 + 1;
      std::__cxx11::string::_M_construct((ulong)local_78,(char)uVar12 - (char)((int)uVar13 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar13 >> 0x1f) + (long)local_78[0]),uVar12,uVar11);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x1060a6);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_108 = *plVar9;
        lStack_100 = plVar6[3];
        local_118 = &local_108;
      }
      else {
        local_108 = *plVar9;
        local_118 = (long *)*plVar6;
      }
      local_110 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_e8 = *plVar9;
        lStack_e0 = plVar6[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *plVar9;
        local_f8 = (long *)*plVar6;
      }
      local_f0 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_190 = *puVar10;
        lStack_188 = plVar6[3];
        local_1a0 = &local_190;
      }
      else {
        local_190 = *puVar10;
        local_1a0 = (ulong *)*plVar6;
      }
      local_198 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      uVar11 = 1;
      if (8 < local_38) {
        uVar8 = local_180;
        uVar13 = 4;
        do {
          uVar11 = uVar13;
          uVar12 = (uint)uVar8;
          if (uVar12 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_0010355c;
          }
          if (uVar12 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_0010355c;
          }
          if (uVar12 < 10000) goto LAB_0010355c;
          uVar8 = (uVar8 & 0xffffffff) / 10000;
          uVar13 = uVar11 + 4;
        } while (99999 < uVar12);
        uVar11 = uVar11 + 1;
      }
LAB_0010355c:
      local_178 = local_168;
      std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar11);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_178,uVar11,(uint)local_180);
      uVar8 = 0xf;
      if (local_1a0 != &local_190) {
        uVar8 = local_190;
      }
      if (uVar8 < (ulong)(local_170 + local_198)) {
        uVar8 = 0xf;
        if (local_178 != local_168) {
          uVar8 = local_168[0];
        }
        if (uVar8 < (ulong)(local_170 + local_198)) goto LAB_001035d4;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_1a0);
      }
      else {
LAB_001035d4:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_178);
      }
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_148 = *plVar6;
        uStack_140 = puVar7[3];
        local_158 = &local_148;
      }
      else {
        local_148 = *plVar6;
        local_158 = (long *)*puVar7;
      }
      local_150 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)plVar6 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_48 = *plVar9;
        lStack_40 = plVar6[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar9;
        local_58 = (long *)*plVar6;
      }
      local_50 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_58,(ulong)(this->velocity_)._M_dataplus._M_p);
      local_d8 = &local_c8;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_c8 = *plVar9;
        lStack_c0 = plVar6[3];
      }
      else {
        local_c8 = *plVar9;
        local_d8 = (long *)*plVar6;
      }
      local_d0 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_b8 = &local_a8;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_a8 = *plVar9;
        lStack_a0 = plVar6[3];
      }
      else {
        local_a8 = *plVar9;
        local_b8 = (long *)*plVar6;
      }
      local_b0 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b8,(ulong)(this->cnt_)._M_dataplus._M_p);
      local_98 = &local_88;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_88 = *plVar9;
        lStack_80 = plVar6[3];
      }
      else {
        local_88 = *plVar9;
        local_98 = (long *)*plVar6;
      }
      local_90 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
      local_138 = &local_128;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_128 = *plVar9;
        lStack_120 = plVar6[3];
      }
      else {
        local_128 = *plVar9;
        local_138 = (long *)*plVar6;
      }
      local_130 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)this,(ulong)local_138);
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,local_148 + 1);
      }
      if (local_178 != local_168) {
        operator_delete(local_178,local_168[0] + 1);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,local_190 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      uVar8 = ((long)(this->pos_).
                     super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->pos_).
                     super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    } while (local_180 <= uVar8 && uVar8 - local_180 != 0);
  }
  this->line_cnt = this->line_cnt + (int)uVar8;
  return;
}

Assistant:

void generate_LS::left_command() {
        line_cnt = line_cnt - pos_.size() + 2;
        for(int i = 0; i < pos_.size(); i++){
            program.append("\t"+std::to_string(i+line_cnt+1)+":L"+" P["+std::to_string(i+1)+"] "+velocity_+"mm/sec "+cnt_+";\n");

        }
        line_cnt += pos_.size();
    }